

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::HistogramTest_bucket_counts_not_reset_by_collection_Test::
~HistogramTest_bucket_counts_not_reset_by_collection_Test
          (HistogramTest_bucket_counts_not_reset_by_collection_Test *this)

{
  HistogramTest_bucket_counts_not_reset_by_collection_Test *this_local;
  
  ~HistogramTest_bucket_counts_not_reset_by_collection_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(HistogramTest, bucket_counts_not_reset_by_collection) {
  Histogram histogram{{1, 2}};
  histogram.Observe(1.5);
  histogram.Collect();
  histogram.Observe(1.5);
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  ASSERT_EQ(h.bucket.size(), 3U);
  EXPECT_EQ(h.bucket.at(1).cumulative_count, 2U);
}